

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::assertionEnded(RunContext *this,AssertionResult *result)

{
  bool bVar1;
  OfType OVar2;
  TestCaseInfo *this_00;
  pointer pIVar3;
  AssertionResult *in_RSI;
  AssertionResult *in_RDI;
  AssertionResult *in_stack_fffffffffffffeb0;
  AssertionStats *this_01;
  Option<Catch::AssertionResult> *in_stack_fffffffffffffec0;
  RunContext *in_stack_fffffffffffffed0;
  Totals *in_stack_ffffffffffffffa8;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_ffffffffffffffb0;
  AssertionResult *in_stack_ffffffffffffffb8;
  AssertionStats *in_stack_ffffffffffffffc0;
  
  OVar2 = AssertionResult::getResultType(in_RSI);
  if (OVar2 == Ok) {
    *(long *)((long)&in_RDI[1].m_resultData.reconstructedExpression.field_2 + 8) =
         *(long *)((long)&in_RDI[1].m_resultData.reconstructedExpression.field_2 + 8) + 1;
    in_RDI[3].m_resultData.reconstructedExpression.field_2._M_local_buf[9] = '\x01';
  }
  else {
    bVar1 = AssertionResult::isOk(in_stack_fffffffffffffeb0);
    if (bVar1) {
      in_RDI[3].m_resultData.reconstructedExpression.field_2._M_local_buf[9] = '\x01';
    }
    else {
      in_RDI[3].m_resultData.reconstructedExpression.field_2._M_local_buf[9] = '\0';
      this_00 = TestCase::getTestCaseInfo(*(TestCase **)&(in_RDI->m_resultData).message);
      bVar1 = TestCaseInfo::okToFail(this_00);
      if (bVar1) {
        *(long *)&in_RDI[1].m_resultData.lazyExpression.m_isNegated =
             *(long *)&in_RDI[1].m_resultData.lazyExpression.m_isNegated + 1;
      }
      else {
        in_RDI[1].m_resultData.lazyExpression.m_transientExpression =
             (ITransientExpression *)
             ((long)&(in_RDI[1].m_resultData.lazyExpression.m_transientExpression)->
                     _vptr_ITransientExpression + 1);
      }
    }
  }
  pIVar3 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x13f25b);
  this_01 = (AssertionStats *)&stack0xfffffffffffffed0;
  AssertionStats::AssertionStats
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
             in_stack_ffffffffffffffa8);
  (*pIVar3->_vptr_IStreamingReporter[10])(pIVar3,this_01);
  AssertionStats::~AssertionStats(this_01);
  OVar2 = AssertionResult::getResultType(in_RSI);
  if (OVar2 != Warning) {
    clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
              ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)0x13f2cd);
  }
  resetAssertionInfo(in_stack_fffffffffffffed0);
  Option<Catch::AssertionResult>::operator=(in_stack_fffffffffffffec0,in_RDI);
  return;
}

Assistant:

void RunContext::assertionEnded(AssertionResult const & result) {
        if (result.getResultType() == ResultWas::Ok) {
            m_totals.assertions.passed++;
            m_lastAssertionPassed = true;
        } else if (!result.isOk()) {
            m_lastAssertionPassed = false;
            if( m_activeTestCase->getTestCaseInfo().okToFail() )
                m_totals.assertions.failedButOk++;
            else
                m_totals.assertions.failed++;
        }
        else {
            m_lastAssertionPassed = true;
        }

        // We have no use for the return value (whether messages should be cleared), because messages were made scoped
        // and should be let to clear themselves out.
        static_cast<void>(m_reporter->assertionEnded(AssertionStats(result, m_messages, m_totals)));

        if (result.getResultType() != ResultWas::Warning)
            m_messageScopes.clear();

        // Reset working state
        resetAssertionInfo();
        m_lastResult = result;
    }